

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::
         StringMaker<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_void>
         ::convert(string *__return_storage_ptr__,wstring *wstr)

{
  bool bVar1;
  reference pwVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e;
  char local_81;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  _Stack_60;
  wchar_t c;
  const_iterator __end1;
  const_iterator __begin1;
  wstring *__range1;
  string local_38 [8];
  string s;
  wstring *wstr_local;
  
  s.field_2._8_8_ = wstr;
  std::__cxx11::string::string(local_38);
  std::__cxx11::wstring::size();
  std::__cxx11::string::reserve((ulong)local_38);
  __end1._M_current = (wchar_t *)std::__cxx11::wstring::begin();
  _Stack_60._M_current = (wchar_t *)std::__cxx11::wstring::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffa0);
    if (!bVar1) break;
    pwVar2 = __gnu_cxx::
             __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
             ::operator*(&__end1);
    if (*pwVar2 < L'Ā') {
      local_81 = (char)*pwVar2;
    }
    else {
      local_81 = '?';
    }
    std::__cxx11::string::operator+=(local_38,local_81);
    __gnu_cxx::
    __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::operator++(&__end1);
  }
  Detail::stringify<std::__cxx11::string>(__return_storage_ptr__,(Detail *)local_38,e);
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string StringMaker<std::wstring>::convert(const std::wstring& wstr) {
    std::string s;
    s.reserve(wstr.size());
    for (auto c : wstr) {
        s += (c <= 0xff) ? static_cast<char>(c) : '?';
    }
    return ::Catch::Detail::stringify(s);
}